

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O0

int Bac_CommandGet(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Bac_Man_t *p_00;
  char *pcVar4;
  int fVerbose;
  int fMapped;
  int c;
  Bac_Man_t *p;
  Bac_Man_t *pNew;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Bac_AbcGetMan(pAbc);
  bVar1 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar3 = Extra_UtilGetopt(argc,argv,"mvh");
    if (iVar3 == -1) {
      if (p_00 == (Bac_Man_t *)0x0) {
        Abc_Print(1,"Bac_CommandGet(): There is no current design.\n");
      }
      else {
        if (bVar1) {
          if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
            Abc_Print(1,"Bac_CommandGet(): There is no current mapped design.\n");
            return 0;
          }
          p = (Bac_Man_t *)Bac_ManInsertAbc(p_00,pAbc->pNtkCur);
        }
        else {
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            Abc_Print(1,"Bac_CommandGet(): There is no current AIG.\n");
            return 0;
          }
          p = Bac_ManInsertGia(p_00,pAbc->pGia);
        }
        Bac_AbcUpdateMan(pAbc,p);
      }
      return 0;
    }
    if (iVar3 == 0x68) break;
    if (iVar3 == 0x6d) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar3 != 0x76) break;
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  Abc_Print(-2,"usage: @_get [-mvh]\n");
  Abc_Print(-2,"\t         inserts AIG or mapped network into the hierarchical design\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-m     : toggle using mapped network from main-space [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar2) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Bac_CommandGet( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * pNew = NULL, * p = Bac_AbcGetMan(pAbc);
    int c, fMapped = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'm':
            fMapped ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandGet(): There is no current design.\n" );
        return 0;
    }
    if ( fMapped )
    {
        if ( pAbc->pNtkCur == NULL )
        {
            Abc_Print( 1, "Bac_CommandGet(): There is no current mapped design.\n" );
            return 0;
        }
        pNew = (Bac_Man_t *)Bac_ManInsertAbc( p, pAbc->pNtkCur );
    }
    else
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( 1, "Bac_CommandGet(): There is no current AIG.\n" );
            return 0;
        }
        pNew = Bac_ManInsertGia( p, pAbc->pGia );
    }
    Bac_AbcUpdateMan( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: @_get [-mvh]\n" );
    Abc_Print( -2, "\t         inserts AIG or mapped network into the hierarchical design\n" );
    Abc_Print( -2, "\t-m     : toggle using mapped network from main-space [default = %s]\n", fMapped? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}